

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O3

int test::fileno(FILE *__stream)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  
  if (((anonymous_namespace)::fileno_count != 0) &&
     (iVar2 = (anonymous_namespace)::fileno_count + 1,
     bVar3 = (anonymous_namespace)::fileno_count != 3, (anonymous_namespace)::fileno_count = iVar2,
     bVar3)) {
    piVar1 = __errno_location();
    *piVar1 = 4;
    return -1;
  }
  iVar2 = ::fileno(__stream);
  return iVar2;
}

Assistant:

int (test::fileno)(FILE *stream) {
  EMULATE_EINTR(fileno, -1);
#ifdef fileno
  return FMT_POSIX(fileno(stream));
#else
  return ::FMT_POSIX(fileno(stream));
#endif
}